

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O3

CURLcode smb_request_state(Curl_easy *data,_Bool *done)

{
  curl_off_t *pcVar1;
  connectdata *conn;
  smb_request *psVar2;
  char *pcVar3;
  char *__s;
  curl_off_t cVar4;
  connectdata *pcVar5;
  void *pvVar6;
  unsigned_short uVar7;
  unsigned_short uVar8;
  CURLcode CVar9;
  CURLcode CVar10;
  curl_pp_transfer cVar11;
  uint uVar12;
  __pid_t _Var13;
  smb_request *req;
  size_t sVar14;
  size_t sVar15;
  smb_request *req_1;
  long lVar16;
  short sVar17;
  size_t upload_size;
  ulong len;
  long lVar18;
  void *msg;
  smb_tree_disconnect msg_1;
  void *local_478;
  smb_request *local_470;
  undefined1 local_464;
  undefined1 uStack_463;
  undefined1 local_462;
  undefined2 uStack_461;
  undefined1 uStack_45f;
  undefined1 uStack_45e;
  undefined1 uStack_45d;
  undefined1 uStack_45c;
  undefined2 uStack_45b;
  undefined2 uStack_459;
  char acStack_457 [3];
  undefined2 uStack_454;
  undefined1 uStack_452;
  undefined1 uStack_451;
  undefined1 uStack_450;
  undefined4 uStack_44f;
  undefined2 uStack_44b;
  char local_444 [4];
  int local_440;
  short local_433;
  char local_431 [1025];
  
  conn = data->conn;
  psVar2 = (data->req).p.smb;
  local_478 = (void *)0x0;
  if (psVar2->state == SMB_REQUESTING) {
    pcVar3 = (conn->host).name;
    sVar14 = strlen(pcVar3);
    __s = (conn->proto).ftpc.pp.linestart_resp;
    sVar15 = strlen(__s);
    if ((sVar15 + sVar14) - 0x3f7 < 0xfffffffffffffbff) {
      CVar9 = CURLE_FILESIZE_EXCEEDED;
      goto LAB_00515a6a;
    }
    memset(&local_462,0,0x409);
    local_464 = 4;
    uStack_463 = 0xff;
    uStack_459 = 0x5c5c;
    acStack_457[0] = '\0';
    strcpy(acStack_457,pcVar3);
    sVar14 = strlen(pcVar3);
    (acStack_457 + sVar14)[0] = '\\';
    (acStack_457 + sVar14)[1] = '\0';
    strcpy(acStack_457 + sVar14 + 1,__s);
    sVar15 = strlen(__s);
    builtin_strncpy(acStack_457 + sVar15 + sVar14 + 2,"????",4);
    *(undefined2 *)(&uStack_451 + sVar15 + sVar14) = 0x3f;
    uStack_45b = (short)(acStack_457 + ((sVar15 + sVar14) - (long)&uStack_459) + 1) + 7;
    CVar9 = smb_send_message(data,'u',&local_464,
                             (size_t)(acStack_457 + ((sVar15 + sVar14) - (long)&uStack_459) + 1 +
                                     0x12));
    if (CVar9 != CURLE_OK) goto LAB_00515a6a;
    ((data->req).p.imap)->transfer = PPTRANSFER_INFO;
  }
  CVar9 = smb_send_and_recv(data,&local_478);
  pvVar6 = local_478;
  if ((CVar9 != CURLE_OK) && (CVar9 != CURLE_AGAIN)) {
LAB_00515a6a:
    Curl_conncontrol(conn,1);
    return CVar9;
  }
  CVar9 = CURLE_OK;
  if (local_478 == (void *)0x0) {
    return CURLE_OK;
  }
  switch(psVar2->state) {
  case SMB_TREE_CONNECT:
    if (*(int *)((long)local_478 + 9) != 0) {
      CVar10 = CURLE_REMOTE_FILE_NOT_FOUND;
      if (*(int *)((long)local_478 + 9) == 0x50001) {
        CVar10 = CURLE_REMOTE_ACCESS_DENIED;
      }
      psVar2->result = CVar10;
      goto LAB_00515bf2;
    }
    psVar2->tid = *(unsigned_short *)((long)local_478 + 0x1c);
    (conn->proto).ftpc.pp.response_time = 0;
    pcVar3 = ((data->req).p.file)->freepath;
    sVar14 = strlen(pcVar3);
    CVar10 = CURLE_FILESIZE_EXCEEDED;
    if (0xfffffffffffffbfe < sVar14 - 0x400) {
      memset(&local_462,0,0x431);
      local_464 = 0x18;
      uStack_463 = 0xff;
      uStack_45e = (undefined1)sVar14;
      uStack_45d = (undefined1)(sVar14 >> 8);
      local_444[0] = '\a';
      local_444[1] = '\0';
      local_444[2] = '\0';
      local_444[3] = '\0';
      uVar12 = *(uint *)&(data->set).field_0x8e2 >> 0x1a & 1;
      local_440 = uVar12 * 4 + 1;
      uStack_454 = 0;
      uStack_452 = 0;
      uStack_451 = (undefined1)((uVar12 - 2) * 0x40000000 >> 0x18);
      local_433 = (short)sVar14 + 1;
      strcpy(local_431,pcVar3);
      CVar10 = smb_send_message(data,0xa2,&local_464,sVar14 + 0x34);
    }
    cVar11 = PPTRANSFER_NONE;
    break;
  case SMB_OPEN:
    if ((*(int *)((long)local_478 + 9) != 0) || ((ulong)(conn->proto).ftpc.pp.response_time < 100))
    {
      CVar10 = CURLE_REMOTE_FILE_NOT_FOUND;
      if (*(int *)((long)local_478 + 9) == 0x50001) {
        CVar10 = CURLE_REMOTE_ACCESS_DENIED;
      }
      psVar2->result = CVar10;
      goto switchD_0051594a_caseD_5;
    }
    psVar2->fid = *(unsigned_short *)((long)local_478 + 0x2a);
    (data->req).offset = 0;
    if (((data->set).field_0x8e5 & 4) == 0) {
      lVar16 = *(long *)((long)local_478 + 0x5c);
      (data->req).size = lVar16;
      if (lVar16 < 0) {
        CVar10 = CURLE_WEIRD_SERVER_REPLY;
        goto LAB_00515fa3;
      }
      Curl_pgrsSetDownloadSize(data,lVar16);
      if (((data->set).field_0x8e2 & 0x20) != 0) {
        (data->info).filetime = (*(long *)((long)pvVar6 + 0x48) + -0x19db1ded53e8000) / 10000000;
      }
LAB_00515f33:
      (conn->proto).ftpc.pp.response_time = 0;
      cVar4 = (data->req).offset;
      uStack_452 = 0;
      uStack_451 = 0;
      uStack_450 = 0;
      uStack_44b = 0;
      local_462 = 0;
      uStack_461 = 0;
      acStack_457[2] = 0;
      uStack_454 = 0;
      local_464 = 0xc;
      uStack_463 = 0xff;
      uVar7 = ((data->req).p.smb)->fid;
      uStack_45f = (undefined1)uVar7;
      uStack_45e = (undefined1)(uVar7 >> 8);
      uStack_45d = (undefined1)cVar4;
      uStack_45c = (undefined1)((ulong)cVar4 >> 8);
      uStack_45b._0_1_ = (undefined1)((ulong)cVar4 >> 0x10);
      uStack_45b._1_1_ = (undefined1)((ulong)cVar4 >> 0x18);
      uStack_44f = (undefined4)((ulong)cVar4 >> 0x20);
      uStack_459 = 0x8000;
      acStack_457[0] = '\0';
      acStack_457[1] = 0x80;
      CVar10 = smb_send_message(data,'.',&local_464,0x1b);
      cVar11 = PPTRANSFER_NONE|PPTRANSFER_INFO;
      break;
    }
    cVar4 = (data->state).infilesize;
    (data->req).size = cVar4;
    Curl_pgrsSetUploadSize(data,cVar4);
    lVar16 = (data->req).size;
    lVar18 = (data->req).bytecount;
LAB_00515d9a:
    (conn->proto).ftpc.pp.response_time = 0;
    cVar4 = (data->req).offset;
    local_470 = (data->req).p.smb;
    CVar10 = Curl_get_upload_buffer(data);
    if (CVar10 == CURLE_OK) {
      upload_size = lVar16 - lVar18;
      pcVar3 = (data->state).ulbuf;
      if (0x7ffe < (long)upload_size) {
        upload_size = 0x7fff;
      }
      pcVar3[0x20] = '\0';
      pcVar3[0x21] = '\0';
      pcVar3[0x22] = '\0';
      pcVar3[0x23] = '\0';
      pcVar3[0x24] = '\0';
      pcVar3[0x25] = '\0';
      pcVar3[0x26] = '\0';
      pcVar3[0x27] = '\0';
      pcVar3[0x28] = '\0';
      pcVar3[0x29] = '\0';
      pcVar3[0x2a] = '\0';
      pcVar3[0x2b] = '\0';
      pcVar3[0x2c] = '\0';
      pcVar3[0x2d] = '\0';
      pcVar3[0x2e] = '\0';
      pcVar3[0x2f] = '\0';
      pcVar3[0x40] = '\0';
      pcVar3[0x41] = '\0';
      pcVar3[0x42] = '\0';
      pcVar3[0x43] = '\0';
      pcVar3[0x30] = '\0';
      pcVar3[0x31] = '\0';
      pcVar3[0x32] = '\0';
      pcVar3[0x33] = '\0';
      pcVar3[0x34] = '\0';
      pcVar3[0x35] = '\0';
      pcVar3[0x36] = '\0';
      pcVar3[0x37] = '\0';
      pcVar3[0x38] = '\0';
      pcVar3[0x39] = '\0';
      pcVar3[0x3a] = '\0';
      pcVar3[0x3b] = '\0';
      pcVar3[0x3c] = '\0';
      pcVar3[0x3d] = '\0';
      pcVar3[0x3e] = '\0';
      pcVar3[0x3f] = '\0';
      pcVar3[0x10] = '\0';
      pcVar3[0x11] = '\0';
      pcVar3[0x12] = '\0';
      pcVar3[0x13] = '\0';
      pcVar3[0x14] = '\0';
      pcVar3[0x15] = '\0';
      pcVar3[0x16] = '\0';
      pcVar3[0x17] = '\0';
      pcVar3[0x18] = '\0';
      pcVar3[0x19] = '\0';
      pcVar3[0x1a] = '\0';
      pcVar3[0x1b] = '\0';
      pcVar3[0x1c] = '\0';
      pcVar3[0x1d] = '\0';
      pcVar3[0x1e] = '\0';
      pcVar3[0x1f] = '\0';
      pcVar3[0] = '\0';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
      pcVar3[8] = '\0';
      pcVar3[9] = '\0';
      pcVar3[10] = '\0';
      pcVar3[0xb] = '\0';
      pcVar3[0xc] = '\0';
      pcVar3[0xd] = '\0';
      pcVar3[0xe] = '\0';
      pcVar3[0xf] = '\0';
      pcVar3[0x24] = '\x0e';
      pcVar3[0x25] = -1;
      *(unsigned_short *)(pcVar3 + 0x29) = local_470->fid;
      *(int *)(pcVar3 + 0x2b) = (int)cVar4;
      *(int *)(pcVar3 + 0x3d) = (int)((ulong)cVar4 >> 0x20);
      sVar17 = (short)upload_size;
      *(short *)(pcVar3 + 0x39) = sVar17;
      pcVar3[0x3b] = '@';
      pcVar3[0x3c] = '\0';
      *(short *)(pcVar3 + 0x41) = sVar17 + 1;
      pcVar5 = data->conn;
      psVar2 = (data->req).p.smb;
      pcVar3[0] = '\0';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
      pcVar3[8] = '\0';
      pcVar3[9] = '\0';
      pcVar3[10] = '\0';
      pcVar3[0xb] = '\0';
      pcVar3[0xc] = '\0';
      pcVar3[0xd] = '\0';
      pcVar3[0xe] = '\0';
      pcVar3[0xf] = '\0';
      pcVar3[0x20] = '\0';
      pcVar3[0x21] = '\0';
      pcVar3[0x22] = '\0';
      pcVar3[0x23] = '\0';
      pcVar3[0x10] = '\0';
      pcVar3[0x11] = '\0';
      pcVar3[0x12] = '\0';
      pcVar3[0x13] = '\0';
      pcVar3[0x14] = '\0';
      pcVar3[0x15] = '\0';
      pcVar3[0x16] = '\0';
      pcVar3[0x17] = '\0';
      pcVar3[0x18] = '\0';
      pcVar3[0x19] = '\0';
      pcVar3[0x1a] = '\0';
      pcVar3[0x1b] = '\0';
      pcVar3[0x1c] = '\0';
      pcVar3[0x1d] = '\0';
      pcVar3[0x1e] = '\0';
      pcVar3[0x1f] = '\0';
      *(ushort *)(pcVar3 + 2) = (sVar17 + 0x40U) * 0x100 | (ushort)(sVar17 + 0x40U) >> 8;
      pcVar3[4] = -1;
      pcVar3[5] = 'S';
      pcVar3[6] = 'M';
      pcVar3[7] = 'B';
      pcVar3[8] = '/';
      pcVar3[0xd] = '\x18';
      pcVar3[0xe] = 'A';
      pcVar3[0xf] = '\0';
      *(unsigned_short *)(pcVar3 + 0x20) = (pcVar5->proto).smbc.uid;
      *(unsigned_short *)(pcVar3 + 0x1c) = psVar2->tid;
      _Var13 = getpid();
      *(short *)(pcVar3 + 0x10) = (short)((uint)_Var13 >> 0x10);
      *(short *)(pcVar3 + 0x1e) = (short)_Var13;
      CVar10 = smb_send(data,0x44,upload_size);
      cVar11 = 4;
      break;
    }
    goto LAB_00515ffc;
  case SMB_DOWNLOAD:
    CVar10 = CURLE_RECV_ERROR;
    if ((*(int *)((long)local_478 + 9) == 0) && (0x31 < (ulong)(conn->proto).ftpc.pp.response_time))
    {
      uVar7 = Curl_read16_le((uchar *)((long)local_478 + 0x2f));
      uVar8 = Curl_read16_le((uchar *)((long)pvVar6 + 0x31));
      if (uVar7 == 0) {
        len = 0;
LAB_00515f07:
        lVar16 = (data->req).bytecount + len;
        (data->req).bytecount = lVar16;
        pcVar1 = &(data->req).offset;
        *pcVar1 = *pcVar1 + len;
        Curl_pgrsSetDownloadCounter(data,lVar16);
        if ((short)uVar7 < 0) goto LAB_00515f33;
        goto LAB_00515fab;
      }
      len = (ulong)uVar7;
      if ((ulong)(conn->proto).ftpc.pp.response_time < uVar8 + len + 4) {
        Curl_failf(data,"Invalid input packet");
      }
      else {
        CVar10 = Curl_client_write(data,1,(char *)((long)pvVar6 + (ulong)uVar8 + 4),len);
        if (CVar10 == CURLE_OK) goto LAB_00515f07;
      }
    }
LAB_00515fa3:
    psVar2->result = CVar10;
    goto LAB_00515fab;
  case SMB_UPLOAD:
    CVar10 = CURLE_UPLOAD_FAILED;
    if ((*(int *)((long)local_478 + 9) != 0) || ((ulong)(conn->proto).ftpc.pp.response_time < 0x2a))
    goto LAB_00515fa3;
    uVar7 = Curl_read16_le((uchar *)((long)local_478 + 0x29));
    lVar16 = (data->req).bytecount + (ulong)uVar7;
    (data->req).bytecount = lVar16;
    pcVar1 = &(data->req).offset;
    *pcVar1 = *pcVar1 + (ulong)uVar7;
    Curl_pgrsSetUploadCounter(data,lVar16);
    lVar16 = (data->req).size;
    lVar18 = (data->req).bytecount;
    if (lVar18 < lVar16) goto LAB_00515d9a;
LAB_00515fab:
    (conn->proto).ftpc.pp.response_time = 0;
    uStack_45d = 0;
    uStack_45c = 0;
    uStack_461 = 0;
    uStack_45f = 0;
    uStack_45e = 0;
    local_464 = 3;
    uVar7 = ((data->req).p.smb)->fid;
    uStack_463 = (undefined1)uVar7;
    local_462 = (undefined1)(uVar7 >> 8);
    CVar10 = smb_send_message(data,'\x04',&local_464,9);
    cVar11 = 5;
    break;
  case SMB_CLOSE:
switchD_0051594a_caseD_5:
    (conn->proto).ftpc.pp.response_time = 0;
    local_462 = 0;
    local_464 = 0;
    uStack_463 = 0;
    CVar10 = smb_send_message(data,'q',&local_464,3);
    cVar11 = 6;
    break;
  case SMB_TREE_DISCONNECT:
    CVar10 = psVar2->result;
LAB_00515bf2:
    (conn->proto).ftpc.pp.response_time = 0;
    *done = true;
    cVar11 = 7;
    break;
  default:
    (conn->proto).ftpc.pp.response_time = 0;
    return CURLE_OK;
  }
  if (CVar10 == CURLE_OK) {
    ((data->req).p.imap)->transfer = cVar11;
  }
  else {
LAB_00515ffc:
    Curl_conncontrol(conn,1);
    CVar9 = CVar10;
  }
  return CVar9;
}

Assistant:

static CURLcode smb_request_state(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  struct smb_request *req = data->req.p.smb;
  struct smb_header *h;
  struct smb_conn *smbc = &conn->proto.smbc;
  enum smb_req_state next_state = SMB_DONE;
  unsigned short len;
  unsigned short off;
  CURLcode result;
  void *msg = NULL;
  const struct smb_nt_create_response *smb_m;

  /* Start the request */
  if(req->state == SMB_REQUESTING) {
    result = smb_send_tree_connect(data);
    if(result) {
      connclose(conn, "SMB: failed to send tree connect message");
      return result;
    }

    request_state(data, SMB_TREE_CONNECT);
  }

  /* Send the previous message and check for a response */
  result = smb_send_and_recv(data, &msg);
  if(result && result != CURLE_AGAIN) {
    connclose(conn, "SMB: failed to communicate");
    return result;
  }

  if(!msg)
    return CURLE_OK;

  h = msg;

  switch(req->state) {
  case SMB_TREE_CONNECT:
    if(h->status) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      if(h->status == smb_swap32(SMB_ERR_NOACCESS))
        req->result = CURLE_REMOTE_ACCESS_DENIED;
      break;
    }
    req->tid = smb_swap16(h->tid);
    next_state = SMB_OPEN;
    break;

  case SMB_OPEN:
    if(h->status || smbc->got < sizeof(struct smb_nt_create_response)) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      if(h->status == smb_swap32(SMB_ERR_NOACCESS))
        req->result = CURLE_REMOTE_ACCESS_DENIED;
      next_state = SMB_TREE_DISCONNECT;
      break;
    }
    smb_m = (const struct smb_nt_create_response*) msg;
    req->fid = smb_swap16(smb_m->fid);
    data->req.offset = 0;
    if(data->set.upload) {
      data->req.size = data->state.infilesize;
      Curl_pgrsSetUploadSize(data, data->req.size);
      next_state = SMB_UPLOAD;
    }
    else {
      smb_m = (const struct smb_nt_create_response*) msg;
      data->req.size = smb_swap64(smb_m->end_of_file);
      if(data->req.size < 0) {
        req->result = CURLE_WEIRD_SERVER_REPLY;
        next_state = SMB_CLOSE;
      }
      else {
        Curl_pgrsSetDownloadSize(data, data->req.size);
        if(data->set.get_filetime)
          get_posix_time(&data->info.filetime, smb_m->last_change_time);
        next_state = SMB_DOWNLOAD;
      }
    }
    break;

  case SMB_DOWNLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 14) {
      req->result = CURLE_RECV_ERROR;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 11);
    off = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 13);
    if(len > 0) {
      if(off + sizeof(unsigned int) + len > smbc->got) {
        failf(data, "Invalid input packet");
        result = CURLE_RECV_ERROR;
      }
      else
        result = Curl_client_write(data, CLIENTWRITE_BODY,
                                   (char *)msg + off + sizeof(unsigned int),
                                   len);
      if(result) {
        req->result = result;
        next_state = SMB_CLOSE;
        break;
      }
    }
    data->req.bytecount += len;
    data->req.offset += len;
    Curl_pgrsSetDownloadCounter(data, data->req.bytecount);
    next_state = (len < MAX_PAYLOAD_SIZE) ? SMB_CLOSE : SMB_DOWNLOAD;
    break;

  case SMB_UPLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 6) {
      req->result = CURLE_UPLOAD_FAILED;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 5);
    data->req.bytecount += len;
    data->req.offset += len;
    Curl_pgrsSetUploadCounter(data, data->req.bytecount);
    if(data->req.bytecount >= data->req.size)
      next_state = SMB_CLOSE;
    else
      next_state = SMB_UPLOAD;
    break;

  case SMB_CLOSE:
    /* We don't care if the close failed, proceed to tree disconnect anyway */
    next_state = SMB_TREE_DISCONNECT;
    break;

  case SMB_TREE_DISCONNECT:
    next_state = SMB_DONE;
    break;

  default:
    smb_pop_message(conn);
    return CURLE_OK; /* ignore */
  }

  smb_pop_message(conn);

  switch(next_state) {
  case SMB_OPEN:
    result = smb_send_open(data);
    break;

  case SMB_DOWNLOAD:
    result = smb_send_read(data);
    break;

  case SMB_UPLOAD:
    result = smb_send_write(data);
    break;

  case SMB_CLOSE:
    result = smb_send_close(data);
    break;

  case SMB_TREE_DISCONNECT:
    result = smb_send_tree_disconnect(data);
    break;

  case SMB_DONE:
    result = req->result;
    *done = true;
    break;

  default:
    break;
  }

  if(result) {
    connclose(conn, "SMB: failed to send message");
    return result;
  }

  request_state(data, next_state);

  return CURLE_OK;
}